

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::speculateIfConditionHeuristics
          (CheckerVisitor *this,Expr *cond,VarScope *thenScope,VarScope *elseScope,
          unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
          *visited,int32_t evalId,uint flags,bool inv)

{
  Expr *pEVar1;
  bool bVar2;
  TreeOp TVar3;
  LiteralKind LVar4;
  int iVar5;
  uint uVar6;
  CheckerVisitor *this_00;
  _Node_iterator_base<const_SQCompilation::Expr_*,_false> _Var7;
  BinExpr *pBVar8;
  Node *pNVar9;
  LiteralExpr *pLVar10;
  SQInteger SVar11;
  Id *pIVar12;
  CallExpr *this_01;
  ArenaVector<SQCompilation::Expr_*> *this_02;
  const_iterator ppEVar13;
  CheckerVisitor *pCVar14;
  SlotAccessExpr *this_03;
  Node *pNVar15;
  SQChar *__s1;
  VarScope *in_RCX;
  VarScope *in_RDX;
  Expr **in_RDI;
  VarScope *in_R8;
  int in_R9D;
  SQFloat SVar16;
  uint unaff_retaddr;
  uint in_stack_00000008;
  undefined1 in_stack_00000010;
  Expr *checkee;
  Expr *rhs_4;
  Expr *lhs_4;
  BinExpr *bin_4;
  VarScope *rhsEScope;
  VarScope *lhsEScope;
  Expr *rhs_3;
  Expr *lhs_3;
  BinExpr *bin_3;
  uint ne;
  uint pe;
  uint nt;
  uint pt;
  bool accessCheck;
  bool nullCheck;
  Id *checkeeId;
  Expr *typeCheckee;
  LiteralExpr *typeLit;
  Id *rhs_id;
  Id *lhs_id;
  Expr *rhs_2;
  Expr *lhs_2;
  BinExpr *bin_2;
  Expr *receiver_1;
  Expr *testee;
  LiteralExpr *lit_1;
  LiteralExpr *rhs_lit;
  LiteralExpr *lhs_lit;
  Expr *rhs_1;
  Expr *lhs_1;
  BinExpr *bin_1;
  Expr *key;
  Expr *reciever;
  AccessExpr *acc;
  bool notOverriden;
  Expr *eval;
  int32_t evalIndex;
  Expr *callee;
  Expr *arg;
  Expr *parg;
  const_iterator __end2;
  const_iterator __begin2;
  ArenaVector<SQCompilation::Expr_*> *__range2;
  CallExpr *call;
  Expr *receiver;
  uint nf;
  uint pf;
  bool nullCond;
  LiteralExpr *lit;
  Expr *rhs;
  Expr *lhs;
  BinExpr *bin;
  Expr *nullcCheckee;
  bool invertLR;
  UnExpr *u;
  VarScope *thisScope;
  TreeOp op;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb4;
  Expr **in_stack_fffffffffffffdb8;
  unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
  *in_stack_fffffffffffffdc0;
  Id *local_238;
  VarScope *local_228;
  VarScope *local_220;
  VarScope *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  VarScope *in_stack_fffffffffffffe08;
  VarScope *in_stack_fffffffffffffe10;
  CheckerVisitor *in_stack_fffffffffffffe18;
  CheckerVisitor *in_stack_fffffffffffffe20;
  Expr **in_stack_fffffffffffffe28;
  Expr *in_stack_fffffffffffffe30;
  CheckerVisitor *in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  Expr *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 uVar17;
  const_iterator local_c8;
  byte local_99;
  bool local_69;
  TreeOp local_54;
  _Node_iterator_base<const_SQCompilation::Expr_*,_false> local_40;
  undefined3 in_stack_ffffffffffffffd0;
  uint uVar18;
  
  uVar18 = CONCAT13(in_stack_00000010,in_stack_ffffffffffffffd0) & 0x1ffffff;
  this_00 = (CheckerVisitor *)
            deparen((Expr *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  _Var7._M_cur = (__node_type *)
                 std::
                 unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
                 ::find((unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
                         *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                        (key_type *)0x1931b6);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
       ::end((unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
              *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  bVar2 = std::__detail::operator!=
                    ((_Node_iterator_base<const_SQCompilation::Expr_*,_false> *)
                     &stack0xffffffffffffffc8,&local_40);
  if (!bVar2) {
    std::
    unordered_set<SQCompilation::Expr_const*,std::hash<SQCompilation::Expr_const*>,std::equal_to<SQCompilation::Expr_const*>,std::allocator<SQCompilation::Expr_const*>>
    ::emplace<SQCompilation::Expr_const*&>(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_54 = Node::op((Node *)this_00);
    pEVar1 = in_RDI[8];
    if (local_54 == TO_NOT) {
      UnExpr::argument((UnExpr *)this_00);
      speculateIfConditionHeuristics
                (this_00,(Expr *)in_RDX,in_RCX,in_R8,
                 (unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
                  *)CONCAT44(in_R9D,uVar18),(int32_t)((ulong)_Var7._M_cur >> 0x20),unaff_retaddr,
                 SUB81((ulong)_Var7._M_cur >> 0x18,0));
    }
    else {
      local_69 = false;
      if (local_54 == TO_NE) {
        local_54 = TO_EQ;
        uVar18 = (uVar18 ^ 0xff000000) & 0x1ffffff;
      }
      else {
        local_69 = local_54 == TO_OROR;
        if (local_69) {
          local_54 = TO_ANDAND;
          uVar18 = (uVar18 ^ 0xff000000) & 0x1ffffff;
        }
      }
      if ((uVar18 & 0x1000000) != 0) {
        std::swap<SQCompilation::VarScope*>
                  ((VarScope **)&stack0xffffffffffffffe8,(VarScope **)&stack0xffffffffffffffe0);
      }
      bVar2 = detectNullCPattern(in_stack_fffffffffffffe18,
                                 (TreeOp)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                                 (Expr *)in_stack_fffffffffffffe08,in_RDI);
      if (bVar2) {
        uVar18 = (uint)in_stack_fffffffffffffe40;
        uVar6 = (uint)((ulong)in_stack_fffffffffffffe40 >> 0x20);
        if ((local_54 == TO_LE) || (local_54 == TO_GE)) {
          if (in_RCX != (VarScope *)0x0) {
            in_RDI[8] = (Expr *)in_RCX;
            setValueFlags((CheckerVisitor *)
                          CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                          in_stack_fffffffffffffe48,uVar6,uVar18);
          }
        }
        else if (local_54 == TO_EQ) {
          if (in_RCX != (VarScope *)0x0) {
            in_RDI[8] = (Expr *)in_RCX;
            setValueFlags((CheckerVisitor *)
                          CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                          in_stack_fffffffffffffe48,uVar6,uVar18);
          }
        }
        else if (in_RDX != (VarScope *)0x0) {
          in_RDI[8] = (Expr *)in_RDX;
          setValueFlags((CheckerVisitor *)
                        CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                        in_stack_fffffffffffffe48,uVar6,uVar18);
        }
        in_RDI[8] = pEVar1;
      }
      else if (local_54 == TO_NULLC) {
        pBVar8 = Expr::asBinExpr((Expr *)this_00);
        BinExpr::lhs(pBVar8);
        deparen((Expr *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        BinExpr::rhs(pBVar8);
        pNVar9 = &deparen((Expr *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8))->
                  super_Node;
        TVar3 = Node::op(pNVar9);
        if (TVar3 == TO_LITERAL) {
          pLVar10 = Expr::asLiteral((Expr *)pNVar9);
          LVar4 = LiteralExpr::kind(pLVar10);
          switch(LVar4) {
          case LK_STRING:
            local_99 = 1;
            break;
          case LK_INT:
            SVar11 = LiteralExpr::i(pLVar10);
            local_99 = SVar11 != 0;
            break;
          case LK_FLOAT:
            SVar16 = LiteralExpr::f(pLVar10);
            local_99 = SVar16 != 0.0;
            break;
          case LK_BOOL:
            pLVar10 = Expr::asLiteral((Expr *)pNVar9);
            local_99 = LiteralExpr::b(pLVar10);
            break;
          case LK_NULL:
            local_99 = 0;
          }
          pIVar12 = extractReceiver((Expr *)in_stack_fffffffffffffdc0);
          if (pIVar12 != (Id *)0x0) {
            if ((in_RDX != (VarScope *)0x0) && ((local_99 & 1) == 0)) {
              in_RDI[8] = (Expr *)in_RDX;
              setValueFlags((CheckerVisitor *)
                            CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                            in_stack_fffffffffffffe48,
                            (uint)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                            (uint)in_stack_fffffffffffffe40);
            }
            if ((in_RCX != (VarScope *)0x0) && ((local_99 & 1) != 0)) {
              in_RDI[8] = (Expr *)in_RCX;
              setValueFlags((CheckerVisitor *)
                            CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                            in_stack_fffffffffffffe48,
                            (uint)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                            (uint)in_stack_fffffffffffffe40);
            }
            in_RDI[8] = pEVar1;
          }
        }
      }
      else if (((in_R9D == -1) && (local_54 == TO_CALL)) && (in_RDX != (VarScope *)0x0)) {
        in_RDI[8] = (Expr *)in_RDX;
        this_01 = Expr::asCallExpr((Expr *)this_00);
        this_02 = CallExpr::arguments(this_01);
        local_c8 = ArenaVector<SQCompilation::Expr_*>::begin(this_02);
        ppEVar13 = ArenaVector<SQCompilation::Expr_*>::end(this_02);
        for (; local_c8 != ppEVar13; local_c8 = local_c8 + 1) {
          pNVar9 = &deparen((Expr *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8))->
                    super_Node;
          TVar3 = Node::op(pNVar9);
          if (TVar3 == TO_ID) {
            setValueFlags((CheckerVisitor *)
                          CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                          in_stack_fffffffffffffe48,(uint)((ulong)in_stack_fffffffffffffe40 >> 0x20)
                          ,(uint)in_stack_fffffffffffffe40);
          }
        }
        CallExpr::callee(this_01);
        pIVar12 = extractReceiver((Expr *)in_stack_fffffffffffffdc0);
        if (pIVar12 != (Id *)0x0) {
          setValueFlags((CheckerVisitor *)
                        CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                        in_stack_fffffffffffffe48,(uint)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                        (uint)in_stack_fffffffffffffe40);
        }
        in_RDI[8] = pEVar1;
      }
      else if (local_54 == TO_ID) {
        pCVar14 = (CheckerVisitor *)
                  maybeEval(in_stack_fffffffffffffe20,(Expr *)in_stack_fffffffffffffe18,
                            &in_stack_fffffffffffffe10->evalId,
                            SUB81((ulong)in_stack_fffffffffffffe08 >> 0x38,0));
        iVar5 = in_R9D;
        if ((in_RDX != (VarScope *)0x0) && (-2 < in_R9D)) {
          in_RDI[8] = (Expr *)in_RDX;
          setValueFlags((CheckerVisitor *)
                        CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                        in_stack_fffffffffffffe48,(uint)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                        (uint)in_stack_fffffffffffffe40);
          in_RDI[8] = pEVar1;
        }
        if (((in_RCX != (VarScope *)0x0) && (-2 < in_R9D)) && ((in_stack_00000008 & 1) != 0)) {
          in_RDI[8] = (Expr *)in_RCX;
          setValueFlags((CheckerVisitor *)
                        CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                        in_stack_fffffffffffffe48,(uint)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                        (uint)in_stack_fffffffffffffe40);
          in_RDI[8] = pEVar1;
        }
        if (pCVar14 != this_00) {
          speculateIfConditionHeuristics
                    (this_00,(Expr *)in_RDX,in_RCX,in_R8,
                     (unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
                      *)CONCAT44(iVar5,uVar18),(int32_t)((ulong)_Var7._M_cur >> 0x20),unaff_retaddr,
                     SUB81((ulong)_Var7._M_cur >> 0x18,0));
        }
      }
      else if ((local_54 == TO_GETSLOT) || (local_54 == TO_GETFIELD)) {
        AccessExpr::receiver((AccessExpr *)this_00);
        deparen((Expr *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        pIVar12 = extractReceiver((Expr *)in_stack_fffffffffffffdc0);
        if ((pIVar12 != (Id *)0x0) && (in_RDX != (VarScope *)0x0)) {
          in_RDI[8] = (Expr *)in_RDX;
          setValueFlags((CheckerVisitor *)
                        CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                        in_stack_fffffffffffffe48,(uint)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                        (uint)in_stack_fffffffffffffe40);
        }
        if (local_54 == TO_GETSLOT) {
          this_03 = &Node::asGetSlot((Node *)this_00)->super_SlotAccessExpr;
          SlotAccessExpr::key(this_03);
          deparen((Expr *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          if (in_RDX != (VarScope *)0x0) {
            in_RDI[8] = (Expr *)in_RDX;
            setValueFlags((CheckerVisitor *)
                          CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                          in_stack_fffffffffffffe48,(uint)((ulong)in_stack_fffffffffffffe40 >> 0x20)
                          ,(uint)in_stack_fffffffffffffe40);
          }
        }
        in_RDI[8] = pEVar1;
      }
      else {
        if (local_54 == TO_EQ) {
          pBVar8 = Expr::asBinExpr((Expr *)this_00);
          BinExpr::lhs(pBVar8);
          pNVar9 = &deparen((Expr *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8))->
                    super_Node;
          BinExpr::rhs(pBVar8);
          pNVar15 = &deparen((Expr *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8))
                     ->super_Node;
          TVar3 = Node::op(pNVar9);
          if (TVar3 == TO_LITERAL) {
            local_228 = (VarScope *)Expr::asLiteral((Expr *)pNVar9);
          }
          else {
            local_228 = (VarScope *)0x0;
          }
          in_stack_fffffffffffffde8 = local_228;
          TVar3 = Node::op(pNVar15);
          if (TVar3 == TO_LITERAL) {
            local_220 = (VarScope *)Expr::asLiteral((Expr *)pNVar15);
          }
          else {
            local_220 = (VarScope *)0x0;
          }
          if (local_228 == (VarScope *)0x0) {
            local_228 = local_220;
          }
          if (local_228 == (VarScope *)0x0) {
            return;
          }
          LVar4 = LiteralExpr::kind((LiteralExpr *)local_228);
          if (LVar4 == LK_NULL) {
            speculateIfConditionHeuristics
                      (this_00,(Expr *)in_RDX,in_RCX,in_R8,
                       (unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
                        *)CONCAT44(in_R9D,uVar18),(int32_t)((ulong)_Var7._M_cur >> 0x20),
                       unaff_retaddr,SUB81((ulong)_Var7._M_cur >> 0x18,0));
            return;
          }
          pIVar12 = extractReceiver((Expr *)in_stack_fffffffffffffdc0);
          if ((pIVar12 != (Id *)0x0) && (in_RDX != (VarScope *)0x0)) {
            in_RDI[8] = (Expr *)in_RDX;
            setValueFlags((CheckerVisitor *)
                          CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                          in_stack_fffffffffffffe48,(uint)((ulong)in_stack_fffffffffffffe40 >> 0x20)
                          ,(uint)in_stack_fffffffffffffe40);
            in_RDI[8] = pEVar1;
          }
        }
        bVar2 = isRelationOperator(local_54);
        if (bVar2) {
          pBVar8 = Expr::asBinExpr((Expr *)this_00);
          BinExpr::lhs(pBVar8);
          pNVar9 = &deparen((Expr *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8))->
                    super_Node;
          BinExpr::rhs(pBVar8);
          pNVar15 = &deparen((Expr *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8))
                     ->super_Node;
          TVar3 = Node::op(pNVar9);
          if (TVar3 == TO_ID) {
            local_238 = Node::asId(pNVar9);
          }
          else {
            local_238 = (Id *)0x0;
          }
          TVar3 = Node::op(pNVar15);
          if (TVar3 == TO_ID) {
            pIVar12 = Node::asId(pNVar15);
          }
          else {
            pIVar12 = (Id *)0x0;
          }
          if (in_RDX != (VarScope *)0x0) {
            in_RDI[8] = (Expr *)in_RDX;
            if (local_238 != (Id *)0x0) {
              setValueFlags((CheckerVisitor *)
                            CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                            in_stack_fffffffffffffe48,
                            (uint)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                            (uint)in_stack_fffffffffffffe40);
            }
            if (pIVar12 != (Id *)0x0) {
              setValueFlags((CheckerVisitor *)
                            CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                            in_stack_fffffffffffffe48,
                            (uint)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                            (uint)in_stack_fffffffffffffe40);
            }
            in_RDI[8] = pEVar1;
          }
        }
        else {
          bVar2 = detectTypeOfPattern(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                      in_stack_fffffffffffffe28,
                                      (LiteralExpr **)in_stack_fffffffffffffe20);
          if (bVar2) {
            pIVar12 = extractReceiver((Expr *)in_stack_fffffffffffffdc0);
            if (pIVar12 != (Id *)0x0) {
              __s1 = LiteralExpr::s((LiteralExpr *)0x0);
              iVar5 = strcmp(__s1,"null");
              uVar17 = 0;
              if (iVar5 == 0) {
                uVar17 = 2;
              }
              if (in_RDX != (VarScope *)0x0) {
                in_RDI[8] = (Expr *)in_RDX;
                setValueFlags((CheckerVisitor *)CONCAT44(uVar17,in_stack_fffffffffffffe50),
                              in_stack_fffffffffffffe48,
                              (uint)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                              (uint)in_stack_fffffffffffffe40);
              }
              if (in_RCX != (VarScope *)0x0) {
                in_RDI[8] = (Expr *)in_RCX;
                setValueFlags((CheckerVisitor *)CONCAT44(uVar17,in_stack_fffffffffffffe50),
                              in_stack_fffffffffffffe48,
                              (uint)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                              (uint)in_stack_fffffffffffffe40);
              }
              in_RDI[8] = pEVar1;
            }
          }
          else if (local_54 == TO_ANDAND) {
            pBVar8 = Expr::asBinExpr((Expr *)this_00);
            BinExpr::lhs(pBVar8);
            BinExpr::rhs(pBVar8);
            if (in_RCX != (VarScope *)0x0) {
              VarScope::copy(in_RCX,(EVP_PKEY_CTX *)in_RDI[0x29],(EVP_PKEY_CTX *)0x0);
              VarScope::copy(in_RCX,(EVP_PKEY_CTX *)in_RDI[0x29],(EVP_PKEY_CTX *)0x0);
            }
            speculateIfConditionHeuristics
                      (this_00,(Expr *)in_RDX,in_RCX,in_R8,
                       (unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
                        *)CONCAT44(in_R9D,uVar18),(int32_t)((ulong)_Var7._M_cur >> 0x20),
                       unaff_retaddr,SUB81((ulong)_Var7._M_cur >> 0x18,0));
            uVar6 = (uint)local_69;
            speculateIfConditionHeuristics
                      (this_00,(Expr *)in_RDX,in_RCX,in_R8,
                       (unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
                        *)CONCAT44(in_R9D,uVar18),(int32_t)((ulong)_Var7._M_cur >> 0x20),
                       unaff_retaddr,SUB81((ulong)_Var7._M_cur >> 0x18,0));
            if (in_RCX != (VarScope *)0x0) {
              VarScope::intersectScopes(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
              VarScope::copyFrom((VarScope *)
                                 CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                                 in_stack_fffffffffffffde8);
              VarScope::~VarScope((VarScope *)CONCAT44(in_stack_fffffffffffffdb4,uVar6));
              VarScope::~VarScope((VarScope *)CONCAT44(in_stack_fffffffffffffdb4,uVar6));
            }
          }
          else if ((local_54 == TO_INSTANCEOF) || (local_54 == TO_IN)) {
            pBVar8 = Expr::asBinExpr((Expr *)this_00);
            BinExpr::lhs(pBVar8);
            BinExpr::rhs(pBVar8);
            pIVar12 = extractReceiver((Expr *)in_stack_fffffffffffffdc0);
            if ((pIVar12 != (Id *)0x0) && (in_RDX != (VarScope *)0x0)) {
              in_RDI[8] = (Expr *)in_RDX;
              setValueFlags((CheckerVisitor *)
                            CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                            in_stack_fffffffffffffe48,
                            (uint)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                            (uint)in_stack_fffffffffffffe40);
            }
            if (((local_54 == TO_IN) &&
                (pIVar12 = extractReceiver((Expr *)in_stack_fffffffffffffdc0), pIVar12 != (Id *)0x0)
                ) && (in_RDX != (VarScope *)0x0)) {
              in_RDI[8] = (Expr *)in_RDX;
              setValueFlags((CheckerVisitor *)
                            CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                            in_stack_fffffffffffffe48,
                            (uint)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                            (uint)in_stack_fffffffffffffe40);
            }
            in_RDI[8] = pEVar1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::speculateIfConditionHeuristics(const Expr *cond, VarScope *thenScope, VarScope *elseScope, std::unordered_set<const Expr *> &visited, int32_t evalId, unsigned flags, bool inv) {
  cond = deparen(cond);

  if (visited.find(cond) != visited.end()) {
    return;
  }

  visited.emplace(cond);

  enum TreeOp op = cond->op();

  VarScope *thisScope = currentScope;

  if (op == TO_NOT) {
    const UnExpr *u = static_cast<const UnExpr *>(cond);
    return speculateIfConditionHeuristics(u->argument(), thenScope, elseScope, visited, evalId, flags, !inv);
  }

  bool invertLR = false;
  if (op == TO_NE) {
    op = TO_EQ;
    inv = !inv;
  } else if (op == TO_OROR) {
    // apply a || b <==> !(!a && !b)
    op = TO_ANDAND;
    invertLR = true;
    inv = !inv;
  }

  if (inv) {
    std::swap(thenScope, elseScope);
  }

  const Expr *nullcCheckee = nullptr;
  if (detectNullCPattern(op, cond, nullcCheckee)) {
    // (o?.f ?? D) == V -- assume else-branch implies `o` non-null
    // (o?.f ?? D) > V -- then-b implies `o` non-null
    // (o?.f ?? D) < V -- then-b implies `o` non-null

    if (op == TO_LE || op == TO_GE) {
      if (elseScope) {
        currentScope = elseScope;
        setValueFlags(nullcCheckee, 0, RT_NULL);
      }
    } else if (op == TO_EQ) {
      if (elseScope) {
        currentScope = elseScope;
        setValueFlags(nullcCheckee, 0, RT_NULL);
      }
    }
    else {
      assert(op == TO_LT || op == TO_GT);
      if (thenScope) {
        currentScope = thenScope;
        setValueFlags(nullcCheckee, 0, RT_NULL);
      }
    }

    currentScope = thisScope; // -V519
    return;
  }

  if (op == TO_NULLC) {
    // o?.f ?? false
    // o?.f ?? true
    const BinExpr *bin = cond->asBinExpr();
    const Expr *lhs = deparen(bin->lhs());
    const Expr *rhs = deparen(bin->rhs());

    if (rhs->op() != TO_LITERAL) { // -V522
      return;
    }

    const LiteralExpr *lit = rhs->asLiteral();
    bool nullCond;
    switch (lit->kind())
    {
    case LK_BOOL:
      nullCond = rhs->asLiteral()->b();
      break;
    case LK_NULL:
      nullCond = false;
      break;
    case LK_INT:
      nullCond = lit->i() != 0;
      break;
    case LK_FLOAT:
      nullCond = lit->f() != 0.0f;
      break;
    case LK_STRING:
      nullCond = true;
      break;
    default:
      assert(0 && "unknown literal kind");
      break;
    }

    unsigned pf, nf;

    if (nullCond) {
      pf = RT_NULL;
      nf = 0;
    }
    else {
      pf = 0;
      nf = RT_NULL;
    }

    const Expr *receiver = extractReceiver(lhs);

    if (!receiver)
      return;

    if (thenScope && !nullCond) {
      currentScope = thenScope;
      setValueFlags(receiver, pf, nf);
    }

    if (elseScope && nullCond) {
      currentScope = elseScope;
      setValueFlags(receiver, nf, pf); // -V764
    }

    currentScope = thisScope; // -V519

    return;
  }

  if (evalId == -1 && op == TO_CALL && thenScope) {
    // if condition looks like `if (foo(x)) x.bar()` consider call as null check
    currentScope = thenScope;
    const CallExpr *call = cond->asCallExpr();
    for (auto parg : call->arguments()) {
      auto arg = deparen(parg);
      if (arg->op() == TO_ID) { // -V522
        setValueFlags(arg, 0, RT_NULL);
      }
    }

    const Expr *callee = extractReceiver(call->callee());
    if (callee) {
      setValueFlags(callee, 0, RT_NULL);
    }

    currentScope = thisScope; // -V519
    return;
  }

  if (op == TO_ID) {
    int32_t evalIndex = -1;
    const Expr *eval = maybeEval(cond, evalIndex);

    bool notOverriden = evalId == -1 || evalIndex < evalId;

    if (thenScope && notOverriden) {
      // set iff it was explicit check like `if (o) { .. }`
      // otherwise there could be complexities, see intersected_assignment.nut
      currentScope = thenScope;
      setValueFlags(cond, 0, RT_NULL);
      currentScope = thisScope;
    }

    if (elseScope && notOverriden && (flags & NULL_CHECK_F)) {
      // set NULL iff it was explicit null check `if (o == null) { ... }` otherwise it could not be null, see w233_inc_in_for.nut
      currentScope = elseScope;
      setValueFlags(cond, RT_NULL, 0);
      currentScope = thisScope;
    }

    if (eval != cond) {
      // let cond = x != null
      // if (cond) { ... }
      speculateIfConditionHeuristics(eval, thenScope, elseScope, visited, evalIndex, flags, false);
    }
    return;
  }

  if (op == TO_GETSLOT || op == TO_GETFIELD) {
    // x?[y]
    const AccessExpr *acc = static_cast<const AccessExpr *>(cond);
    const Expr *reciever = extractReceiver(deparen(acc->receiver()));

    if (reciever && thenScope) {
      currentScope = thenScope;
      setValueFlags(reciever, 0, RT_NULL);
    }

    if (op == TO_GETSLOT) {
      const Expr *key = deparen(acc->asGetSlot()->key());
      if (thenScope) {
        currentScope = thenScope;
        setValueFlags(key, 0, RT_NULL);
      }
    }

    currentScope = thisScope; // -V519

    return;
  }

  if (op == TO_EQ) {
    const BinExpr *bin = cond->asBinExpr();
    const Expr *lhs = deparen(bin->lhs());
    const Expr *rhs = deparen(bin->rhs());

    const LiteralExpr *lhs_lit = lhs->op() == TO_LITERAL ? lhs->asLiteral() : nullptr; // -V522
    const LiteralExpr *rhs_lit = rhs->op() == TO_LITERAL ? rhs->asLiteral() : nullptr; // -V522

    const LiteralExpr *lit = lhs_lit ? lhs_lit : rhs_lit;
    const Expr *testee = lit == lhs ? rhs : lhs;

    if (!lit)
      return;

    if (lit->kind() == LK_NULL) {
      speculateIfConditionHeuristics(testee, elseScope, thenScope, visited, evalId, flags | NULL_CHECK_F, false);
      return;
    }

    const Expr *receiver = extractReceiver(testee);

    if (receiver && thenScope) {
      currentScope = thenScope;
      setValueFlags(receiver, 0, RT_NULL);
      currentScope = thisScope;
    }

  }

  if (isRelationOperator(op)) {
    const BinExpr *bin = cond->asBinExpr();
    const Expr *lhs = deparen(bin->lhs());
    const Expr *rhs = deparen(bin->rhs());

    const Id *lhs_id = lhs->op() == TO_ID ? lhs->asId() : nullptr; // -V522
    const Id *rhs_id = rhs->op() == TO_ID ? rhs->asId() : nullptr; // -V522

    if (thenScope) {
      currentScope = thenScope;
      if (lhs_id) {
        setValueFlags(lhs_id, 0, RT_NULL);
      }
      if (rhs_id) {
        setValueFlags(rhs_id, 0, RT_NULL);
      }
      currentScope = thisScope;
    }
    return;
  }

  const LiteralExpr *typeLit = nullptr;
  const Expr *typeCheckee = nullptr;

  if (detectTypeOfPattern(cond, typeCheckee, typeLit)) {
    assert(typeCheckee && typeLit);

    const Id *checkeeId = extractReceiver(typeCheckee);
    if (!checkeeId)
      return;

    bool nullCheck = strcmp(typeLit->s(), _SC("null")) == 0; // todo: should it be more precise in case of avaliable names
    bool accessCheck = typeCheckee != checkeeId;

    // if it's null check we could know for sure that true-branch implies NULL and false-branch implies NON_NULL
    // if it's not a null check we could only guarantee that true-branch implies NON_NULL
    unsigned pt = 0, nt = 0, pe = 0, ne = 0;

    if (nullCheck) {
      if (accessCheck) {
        ne = RT_NULL;
      }
      else {
        pt = RT_NULL;
        ne = RT_NULL;
      }
    }
    else {
      nt = RT_NULL;
    }

    if (thenScope) {
      currentScope = thenScope;
      setValueFlags(checkeeId, pt, nt);
    }
    if (elseScope) {
      currentScope = elseScope;
      setValueFlags(checkeeId, pe, ne);
    }

    currentScope = thisScope; // -V519

    return;
  }

  if (op == TO_ANDAND) {
    const BinExpr *bin = cond->asBinExpr();
    const Expr *lhs = bin->lhs();
    const Expr *rhs = bin->rhs();

    VarScope *lhsEScope = nullptr;
    VarScope *rhsEScope = nullptr;

    // In '&&' operator all effects of the left-hand side work for the right side as well
    if (elseScope) {
      lhsEScope = elseScope->copy(arena);
      rhsEScope = elseScope->copy(arena);
    }

    speculateIfConditionHeuristics(lhs, thenScope, lhsEScope, visited, evalId, flags, invertLR);
    speculateIfConditionHeuristics(rhs, thenScope, rhsEScope, visited, evalId, flags, invertLR);

    if (elseScope) {
      // In contrast in `false`-branch there is no such integral effect, all we could say is something common of both side so
      // to compute that `common` part intersect lhs with rhs
      lhsEScope->intersectScopes(rhsEScope); // -V522
      elseScope->copyFrom(lhsEScope);

      lhsEScope->~VarScope();
      rhsEScope->~VarScope();
    }

    return;
  }

  if (op == TO_INSTANCEOF || op == TO_IN) {
    const BinExpr *bin = cond->asBinExpr();
    const Expr *lhs = bin->lhs();
    const Expr *rhs = bin->rhs();

    const Expr *checkee = extractReceiver(lhs);

    if (checkee && thenScope) {
      currentScope = thenScope;
      setValueFlags(checkee, 0, RT_NULL);
    }

    if (op == TO_IN) {
      checkee = extractReceiver(rhs);
      if (checkee && thenScope) {
        currentScope = thenScope;
        setValueFlags(checkee, 0, RT_NULL);
      }
    }

    currentScope = thisScope; // -V519

    return;
  }
}